

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Joint::removeJoint(Joint *this,Scene *scene)

{
  bool bVar1;
  reference ppJVar2;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *pvVar3;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  local_c0;
  const_iterator local_b8;
  Joint *local_b0;
  Joint **local_a8;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  local_a0;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  local_98;
  const_iterator local_90;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *local_88;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *joints;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  local_78;
  const_iterator local_70;
  Joint *local_68;
  Joint **local_60;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  local_58;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  local_50;
  const_iterator local_48;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *local_40;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *kids;
  Joint *childJoint;
  iterator __end2;
  iterator __begin2;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *__range2;
  Scene *scene_local;
  Joint *this_local;
  
  if (this != this->skeleton->root) {
    __end2 = std::
             vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
             begin(&this->kids);
    childJoint = (Joint *)std::
                          vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                          ::end(&this->kids);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                                       *)&childJoint), bVar1) {
      ppJVar2 = __gnu_cxx::
                __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                ::operator*(&__end2);
      kids = (vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
              *)*ppJVar2;
      removeJoint((Joint *)kids,scene);
      __gnu_cxx::
      __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
      ::operator++(&__end2);
    }
    Scene::removeObject(scene,&this->super_SceneObject);
    pvVar3 = &this->parent->kids;
    local_40 = pvVar3;
    local_58._M_current =
         (Joint **)
         std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
         ::begin(pvVar3);
    local_60 = (Joint **)
               std::
               vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
               ::end(local_40);
    local_68 = this;
    local_50 = std::
               remove<__gnu_cxx::__normal_iterator<CMU462::DynamicScene::Joint**,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>,CMU462::DynamicScene::Joint*>
                         (local_58,(__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                                    )local_60,&local_68);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
    ::__normal_iterator<CMU462::DynamicScene::Joint**>
              ((__normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
                *)&local_48,&local_50);
    local_78._M_current =
         (Joint **)
         std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
         ::end(local_40);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
    ::__normal_iterator<CMU462::DynamicScene::Joint**>
              ((__normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
                *)&local_70,&local_78);
    joints = (vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
              *)std::
                vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                ::erase(pvVar3,local_48,local_70);
    pvVar3 = &this->skeleton->joints;
    local_88 = pvVar3;
    local_a0._M_current =
         (Joint **)
         std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
         ::begin(pvVar3);
    local_a8 = (Joint **)
               std::
               vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
               ::end(local_88);
    local_b0 = this;
    local_98 = std::
               remove<__gnu_cxx::__normal_iterator<CMU462::DynamicScene::Joint**,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>,CMU462::DynamicScene::Joint*>
                         (local_a0,(__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                                    )local_a8,&local_b0);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
    ::__normal_iterator<CMU462::DynamicScene::Joint**>
              ((__normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
                *)&local_90,&local_98);
    local_c0._M_current =
         (Joint **)
         std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
         ::end(local_88);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
    ::__normal_iterator<CMU462::DynamicScene::Joint**>
              ((__normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
                *)&local_b8,&local_c0);
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    erase(pvVar3,local_90,local_b8);
    if (this != (Joint *)0x0) {
      ~Joint(this);
      operator_delete(this,0x160);
    }
  }
  return;
}

Assistant:

void Joint::removeJoint(Scene* scene)
   {
     if (this == skeleton->root)
       return;

     for (auto childJoint : kids)
     {
       childJoint->removeJoint(scene);
     }

     scene->removeObject(this);

     auto & kids = parent->kids;
     kids.erase(std::remove(kids.begin(), kids.end(), this), kids.end());

     auto & joints = skeleton->joints;
     joints.erase(std::remove(joints.begin(), joints.end(), this), joints.end());

     delete this;
   }